

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O0

char * test_matrix4_set_from_quaternion_xz_quarter_turn(void)

{
  int iVar1;
  vector3 *pvVar2;
  quaternion *qT;
  undefined1 local_c8 [8];
  vector3 r;
  quaternion q;
  matrix4 m;
  
  pvVar2 = vector3_get_reference_vector3(1);
  qT = quaternion_set_from_axis_anglev3
                 ((quaternion *)((long)&r.field_0 + 0x10),pvVar2,1.5707963705062866);
  matrix4_make_transformation_rotationq((matrix4 *)((long)&q.field_0 + 0x18),qT);
  pvVar2 = vector3_get_reference_vector3(3);
  pvVar2 = vector3_set((vector3 *)local_c8,pvVar2);
  vector3_multiplym4(pvVar2,(matrix4 *)((long)&q.field_0 + 0x18));
  pvVar2 = vector3_get_reference_vector3(2);
  iVar1 = vector3_equals((vector3 *)local_c8,pvVar2);
  if (iVar1 == 0) {
    m.field_0.m[0xf] = (double)anon_var_dwarf_810;
  }
  else {
    m.field_0.m[0xf] = 0.0;
  }
  return (char *)m.field_0.m[0xf];
}

Assistant:

static char *test_matrix4_set_from_quaternion_xz_quarter_turn(void)
{
	struct matrix4 m;
	struct quaternion q;
	struct vector3 r;

	matrix4_make_transformation_rotationq(&m, quaternion_set_from_axis_anglev3(&q, HYP_VECTOR3_UNIT_X, HYP_TAU / 4.0f));
	vector3_multiplym4(vector3_set(&r, HYP_VECTOR3_UNIT_Z), &m);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_Y));

	return NULL;
}